

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

void __thiscall
mjs::native_object::do_add_native_property
          (native_object *this,char *name,property_attribute attributes,get_func get,put_func put)

{
  property_attribute pVar1;
  native_object_property *pnVar2;
  gc_heap *h;
  gc_vector<mjs::native_object::native_object_property> *this_00;
  native_object_property local_68;
  put_func local_30;
  put_func put_local;
  get_func get_local;
  char *pcStack_18;
  property_attribute attributes_local;
  char *name_local;
  native_object *this_local;
  
  local_30 = put;
  put_local = (put_func)get;
  get_local._4_4_ = attributes;
  pcStack_18 = name;
  name_local = (char *)this;
  pnVar2 = find(this,name);
  if (pnVar2 != (native_object_property *)0x0) {
    __assert_fail("find(name) == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.cpp"
                  ,0x37,
                  "void mjs::native_object::do_add_native_property(const char *, property_attribute, get_func, put_func)"
                 );
  }
  pVar1 = operator&(get_local._4_4_,read_only);
  if ((pVar1 != none) == (local_30 == (put_func)0x0)) {
    h = object::heap(&this->super_object);
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
              ::dereference(&this->native_properties_,h);
    native_object_property::native_object_property
              (&local_68,pcStack_18,get_local._4_4_,(get_func)put_local,local_30);
    gc_vector<mjs::native_object::native_object_property>::push_back(this_00,&local_68);
    return;
  }
  __assert_fail("((attributes & property_attribute::read_only) != property_attribute::none) == !put"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.cpp"
                ,0x38,
                "void mjs::native_object::do_add_native_property(const char *, property_attribute, get_func, put_func)"
               );
}

Assistant:

void native_object::do_add_native_property(const char* name, property_attribute attributes, get_func get, put_func put) {
    assert(find(name) == nullptr);
    assert(((attributes & property_attribute::read_only) != property_attribute::none) == !put);
    native_properties_.dereference(heap()).push_back(native_object_property(name, attributes, get, put));
}